

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
          (bin_writer<3> *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it
          )

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  byte bVar4;
  byte *pbVar5;
  size_t sVar6;
  byte bVar7;
  long lVar8;
  byte *pbVar9;
  ulong uVar10;
  byte abStack_29 [9];
  char buffer [23];
  
  pbVar5 = (byte *)(it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar6 = (it->super_truncating_iterator_base<char_*>).count_;
  bVar7 = it->blackhole_;
  iVar1 = *(int *)(this + 8);
  pbVar9 = abStack_29 + iVar1;
  uVar10 = *(ulong *)this;
  do {
    *pbVar9 = (byte)uVar10 & 7 | 0x30;
    pbVar9 = pbVar9 + -1;
    bVar3 = 7 < uVar10;
    uVar10 = uVar10 >> 3;
  } while (bVar3);
  if (0 < iVar1) {
    lVar8 = 0;
    do {
      bVar4 = abStack_29[lVar8 + 1];
      if (sVar6 + lVar8 < uVar2) {
        *pbVar5 = abStack_29[lVar8 + 1];
        bVar4 = bVar7;
      }
      bVar7 = bVar4;
      pbVar5 = pbVar5 + (sVar6 + lVar8 < uVar2);
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
    sVar6 = sVar6 + lVar8;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = (char *)pbVar5;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar6;
  it->blackhole_ = bVar7;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }